

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O1

shared_ptr<QPDFObject> __thiscall QPDF_String::create_utf16(QPDF_String *this,string *utf8_val)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<QPDFObject> sVar3;
  string result;
  string local_58;
  string local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  bVar1 = QUtil::utf8_to_pdf_doc(utf8_val,&local_58,'?');
  if (!bVar1) {
    QUtil::utf8_to_utf16(&local_38,utf8_val);
    std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  sVar3 = QPDFObject::create<QPDF_String,std::__cxx11::string&>((QPDFObject *)this,&local_58);
  _Var2 = sVar3.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar3.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF_String::create_utf16(std::string const& utf8_val)
{
    std::string result;
    if (!QUtil::utf8_to_pdf_doc(utf8_val, result, '?')) {
        result = QUtil::utf8_to_utf16(utf8_val);
    }
    return QPDFObject::create<QPDF_String>(result);
}